

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O2

bool __thiscall crnlib::lzma_codec::pack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  packed_uint<2U> *this_00;
  uint uVar5;
  bool bVar6;
  size_t destLen;
  size_t outPropsSize;
  uchar *local_48;
  ulong local_40;
  lzma_codec *local_38;
  
  if (n < 0x40000001) {
    uVar4 = 0x80;
    if (0x80 < n >> 8) {
      uVar4 = n >> 8;
    }
    local_38 = this;
    vector<unsigned_char>::resize(buf,n + uVar4 + 0x14,false);
    this_00 = (packed_uint<2U> *)buf->m_p;
    *(undefined4 *)(this_00 + 0x10) = 0;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    packed_uint<4U>::operator=((packed_uint<4U> *)(this_00 + 0xc),n);
    local_40 = (ulong)n;
    uVar1 = adler32(p,local_40,1);
    packed_uint<4U>::operator=((packed_uint<4U> *)(this_00 + 0x10),uVar1);
    if (n == 0) {
LAB_001218c4:
      packed_uint<2U>::operator=(this_00,0x304c);
      uVar1 = adler32(this_00 + 3,0x11,1);
      this_00[2] = SUB41(uVar1,0);
      return true;
    }
    uVar4 = uVar4 + n;
    destLen = 0;
    outPropsSize = 0;
    uVar5 = n + 1 >> 1;
    iVar3 = 3;
    local_48 = (uchar *)p;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      destLen = (size_t)uVar4;
      outPropsSize = 5;
      iVar2 = (*local_38->m_pCompress)
                        ((uchar *)(this_00 + 0x14),&destLen,local_48,local_40,(uchar *)(this_00 + 3)
                         ,&outPropsSize,-1,0,-1,-1,-1,-1,1);
      if (iVar2 != 7) {
        if (iVar2 == 0) {
          packed_uint<4U>::operator=((packed_uint<4U> *)(this_00 + 8),(uint)destLen);
          vector<unsigned_char>::resize(buf,(uint)destLen + 0x14,false);
          goto LAB_001218c4;
        }
        break;
      }
      uVar1 = uVar5 + 0x14 + uVar4;
      uVar4 = uVar4 + uVar5;
      vector<unsigned_char>::resize(buf,uVar1,false);
      this_00 = (packed_uint<2U> *)buf->m_p;
    }
    vector<unsigned_char>::clear(buf);
  }
  return false;
}

Assistant:

bool lzma_codec::pack(const void* p, uint n, crnlib::vector<uint8>& buf)
    {
        if (n > 1024U * 1024U * 1024U)
        {
            return false;
        }

        uint max_comp_size = n + math::maximum<uint>(128, n >> 8);
        buf.resize(sizeof(header) + max_comp_size);

        header* pHDR = reinterpret_cast<header*>(&buf[0]);
        uint8* pComp_data = &buf[sizeof(header)];

        utils::zero_object(*pHDR);

        pHDR->m_uncomp_size = n;
        pHDR->m_adler32 = adler32(p, n);

        if (n)
        {
            size_t destLen = 0;
            size_t outPropsSize = 0;
            int status = SZ_ERROR_INPUT_EOF;

            for (uint trial = 0; trial < 3; trial++)
            {
                destLen = max_comp_size;
                outPropsSize = cLZMAPropsSize;

                status = (*m_pCompress)(pComp_data, &destLen, reinterpret_cast<const unsigned char*>(p), n,
                    pHDR->m_lzma_props, &outPropsSize,
                    -1, /* 0 <= level <= 9, default = 5 */
                    0, /* default = (1 << 24) */
                    -1, /* 0 <= lc <= 8, default = 3  */
                    -1, /* 0 <= lp <= 4, default = 0  */
                    -1, /* 0 <= pb <= 4, default = 2  */
                    -1, /* 5 <= fb <= 273, default = 32 */
#ifdef WIN32
                    (g_number_of_processors > 1) ? 2 : 1
#else
                    1
#endif
                );

                if (status != SZ_ERROR_OUTPUT_EOF)
                {
                    break;
                }

                max_comp_size += ((n + 1) / 2);
                buf.resize(sizeof(header) + max_comp_size);
                pHDR = reinterpret_cast<header*>(&buf[0]);
                pComp_data = &buf[sizeof(header)];
            }

            if (status != SZ_OK)
            {
                buf.clear();
                return false;
            }

            pHDR->m_comp_size = static_cast<uint>(destLen);

            buf.resize(CRNLIB_SIZEOF_U32(header) + static_cast<uint32>(destLen));
        }

        pHDR->m_sig = header::cSig;
        pHDR->m_checksum = static_cast<uint8>(adler32((uint8*)pHDR + header::cChecksumSkipBytes, sizeof(header) - header::cChecksumSkipBytes));

        return true;
    }